

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O2

int AnalyzeFrameSBG(uchar *buf,int buflen,int *pmid,int *pmclass,int *pframelen,
                   int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  ushort uVar1;
  uint16 uVar2;
  uint uVar3;
  int iVar4;
  
  *pframelen = 0;
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 9) {
    *pnbBytesToRequest = 9 - buflen;
LAB_001755d4:
    iVar4 = 6;
  }
  else {
    if ((*buf == 0xff) && (buf[1] == 'Z')) {
      *pmid = (uint)buf[2];
      *pmclass = (uint)buf[3];
      uVar1 = *(ushort *)(buf + 4);
      uVar3 = uVar1 + 9;
      *pframelen = uVar3;
      if ((uint)buflen <= uVar3 && uVar3 - buflen != 0) {
        *pnbBytesToRequest = uVar3 - buflen;
        goto LAB_001755d4;
      }
      uVar2 = CalcCRCSBG(buf + 2,uVar1 + 4);
      if (*(uint16 *)(buf + (long)*pframelen + -3) == uVar2) {
        return 0;
      }
      puts("Warning : SBG CRC error. ");
      *pnbBytesToDiscard = 2;
    }
    else {
      *pnbBytesToDiscard = 1;
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

inline int AnalyzeFrameSBG(unsigned char* buf, int buflen, int* pmid, int* pmclass, int* pframelen, 
							int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	*pframelen = 0;
	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < MIN_FRAME_LEN_SBG)
	{
		*pnbBytesToRequest = MIN_FRAME_LEN_SBG-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if ((buf[0] != SYNC1_SBG)||(buf[1] != SYNC2_SBG))
	{
		*pnbBytesToDiscard = 1; // We are only sure that the first sync byte can be discarded...
		return EXIT_FAILURE;
	}
	*pmid = buf[2];
	*pmclass = buf[3];
	*pframelen = GetFrameLengthSBG(buf);	
	if (buflen < *pframelen)
	{
		*pnbBytesToRequest = *pframelen-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if (CalcCRCSBG(buf+2, (uint16)(*pframelen-5)) != ((buf[*pframelen-2]<<8)+buf[*pframelen-3]))
	{ 
		printf("Warning : SBG CRC error. \n");
		*pnbBytesToDiscard = 2; // We are only sure that the 2 sync bytes can be discarded...
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}